

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

Sign anon_unknown.dwarf_775ed::side3_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2,
               coord_index_t dim)

{
  uint uVar1;
  uint uVar2;
  index_t iVar3;
  index_t iVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  expansion *peVar12;
  expansion *peVar13;
  long lVar14;
  expansion *peVar15;
  index_t iVar16;
  expansion *peVar17;
  expansion *peVar18;
  expansion *peVar19;
  expansion *peVar20;
  long lVar21;
  double dStack_170;
  undefined1 local_168 [8];
  double *p_sort [4];
  expansion *local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  expansion *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  expansion *local_e8;
  double *local_e0;
  expansion *local_d8;
  expansion *local_d0;
  expansion *local_c8;
  double *local_c0;
  expansion *local_b8;
  expansion *local_b0;
  expansion *local_a8;
  expansion *local_a0;
  double *local_98;
  expansion *local_90;
  expansion *local_88;
  expansion *local_80;
  expansion *local_78;
  expansion *local_70;
  expansion *local_68;
  double *local_60;
  expansion *local_58;
  expansion *local_50;
  expansion *local_48;
  Sign local_3c;
  expansion *local_38;
  
  iVar16 = ((uint)dim + (uint)dim) * 3;
  uVar9 = (ulong)(((uint)dim + (uint)dim * 2) * 0x10 + 0x10);
  lVar10 = -uVar9;
  peVar15 = (expansion *)((long)p_sort + lVar10 + -8);
  local_e0 = p1;
  local_98 = p3;
  local_80 = (expansion *)q0;
  local_78 = (expansion *)q1;
  peVar15->length_ = 0;
  *(index_t *)((long)p_sort + lVar10 + -4) = iVar16;
  local_68 = peVar15;
  *(undefined8 *)((long)&dStack_170 + lVar10) = 0x14a129;
  GEO::expansion::assign_sq_dist(peVar15,p1,p0,dim);
  peVar15 = (expansion *)((long)peVar15 - uVar9);
  peVar15->length_ = 0;
  peVar15->capacity_ = iVar16;
  local_c0 = p2;
  local_58 = peVar15;
  peVar15[-1].x_[1] = 6.6798564635899e-318;
  GEO::expansion::assign_sq_dist(peVar15,p2,p0,dim);
  peVar15 = (expansion *)((long)peVar15 - uVar9);
  peVar15->length_ = 0;
  peVar15->capacity_ = iVar16;
  pdVar6 = local_98;
  local_128 = peVar15;
  peVar15[-1].x_[1] = 6.68007879313053e-318;
  GEO::expansion::assign_sq_dist(peVar15,pdVar6,p0,dim);
  iVar16 = (uint)dim * 8;
  local_38 = (expansion *)(ulong)((uint)dim << 6 | 0x10);
  peVar15 = (expansion *)((long)peVar15 - (long)local_38);
  peVar15->length_ = 0;
  peVar15->capacity_ = iVar16;
  peVar13 = local_80;
  pdVar6 = local_e0;
  local_60 = p0;
  peVar15[-1].x_[1] = 6.68040981711325e-318;
  GEO::expansion::assign_dot_at(peVar15,pdVar6,(double *)peVar13,p0,dim);
  local_d0 = (expansion *)(ulong)peVar15->length_;
  if (local_d0 != (expansion *)0x0) {
    uVar9 = 0;
    do {
      peVar15->x_[uVar9] = peVar15->x_[uVar9] + peVar15->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_d0 != (expansion *)uVar9);
  }
  peVar12 = (expansion *)((long)peVar15 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_48 = peVar15;
  peVar12->length_ = 0;
  peVar12->capacity_ = iVar16;
  pdVar7 = local_60;
  peVar13 = local_78;
  pdVar6 = local_e0;
  peVar12[-1].x_[1] = 6.68089894210263e-318;
  GEO::expansion::assign_dot_at(peVar12,pdVar6,(double *)peVar13,pdVar7,dim);
  local_d8 = (expansion *)(ulong)peVar12->length_;
  if (local_d8 != (expansion *)0x0) {
    uVar9 = 0;
    do {
      peVar12->x_[uVar9] = peVar12->x_[uVar9] + peVar12->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_d8 != (expansion *)uVar9);
  }
  peVar13 = (expansion *)((long)peVar12 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_b0 = peVar12;
  peVar13->length_ = 0;
  peVar13->capacity_ = iVar16;
  pdVar7 = local_60;
  pdVar6 = local_e0;
  peVar13[-1].x_[1] = 6.68140288906139e-318;
  GEO::expansion::assign_dot_at(peVar13,pdVar6,q2,pdVar7,dim);
  local_b8 = (expansion *)(ulong)peVar13->length_;
  if (local_b8 != (expansion *)0x0) {
    uVar9 = 0;
    do {
      peVar13->x_[uVar9] = peVar13->x_[uVar9] + peVar13->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_b8 != (expansion *)uVar9);
  }
  peVar12 = (expansion *)((long)peVar13 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar12->length_ = 0;
  peVar12->capacity_ = iVar16;
  pdVar7 = local_60;
  peVar15 = local_80;
  pdVar6 = local_c0;
  peVar12[-1].x_[1] = 6.6818771920814e-318;
  GEO::expansion::assign_dot_at(peVar12,pdVar6,(double *)peVar15,pdVar7,dim);
  local_c8 = (expansion *)(ulong)peVar12->length_;
  if (local_c8 != (expansion *)0x0) {
    uVar9 = 0;
    do {
      peVar12->x_[uVar9] = peVar12->x_[uVar9] + peVar12->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_c8 != (expansion *)uVar9);
  }
  peVar20 = (expansion *)((long)peVar12 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_a0 = peVar12;
  peVar20->length_ = 0;
  peVar20->capacity_ = iVar16;
  pdVar7 = local_60;
  peVar15 = local_78;
  pdVar6 = local_c0;
  peVar20[-1].x_[1] = 6.68240090166599e-318;
  GEO::expansion::assign_dot_at(peVar20,pdVar6,(double *)peVar15,pdVar7,dim);
  local_90 = (expansion *)(ulong)peVar20->length_;
  if (local_90 != (expansion *)0x0) {
    uVar9 = 0;
    do {
      peVar20->x_[uVar9] = peVar20->x_[uVar9] + peVar20->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_90 != (expansion *)uVar9);
  }
  peVar15 = (expansion *)((long)peVar20 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar15->length_ = 0;
  local_70 = (expansion *)CONCAT44(local_70._4_4_,iVar16);
  peVar15->capacity_ = iVar16;
  pdVar7 = local_60;
  pdVar6 = local_c0;
  local_50 = (expansion *)(ulong)dim;
  peVar15[-1].x_[1] = 6.68293943321995e-318;
  GEO::expansion::assign_dot_at(peVar15,pdVar6,q2,pdVar7,dim);
  uVar1 = peVar15->length_;
  if ((ulong)uVar1 != 0) {
    uVar9 = 0;
    do {
      peVar15->x_[uVar9] = peVar15->x_[uVar9] + peVar15->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  peVar17 = (expansion *)((long)peVar15 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar17->length_ = 0;
  peVar17->capacity_ = (index_t)local_70;
  peVar19 = local_50;
  pdVar7 = local_60;
  peVar12 = local_80;
  pdVar6 = local_98;
  peVar17[-1].x_[1] = 6.68342361755288e-318;
  GEO::expansion::assign_dot_at(peVar17,pdVar6,(double *)peVar12,pdVar7,(coord_index_t)peVar19);
  local_110 = (ulong)peVar17->length_;
  if (local_110 != 0) {
    uVar9 = 0;
    do {
      peVar17->x_[uVar9] = peVar17->x_[uVar9] + peVar17->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_110 != uVar9);
  }
  peVar18 = (expansion *)((long)peVar17 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_80 = peVar17;
  peVar18->length_ = 0;
  peVar18->capacity_ = (index_t)local_70;
  peVar19 = local_50;
  pdVar7 = local_60;
  peVar12 = local_78;
  pdVar6 = local_98;
  peVar18[-1].x_[1] = 6.68396214910685e-318;
  GEO::expansion::assign_dot_at(peVar18,pdVar6,(double *)peVar12,pdVar7,(coord_index_t)peVar19);
  local_118 = (ulong)peVar18->length_;
  if (local_118 != 0) {
    uVar9 = 0;
    do {
      peVar18->x_[uVar9] = peVar18->x_[uVar9] + peVar18->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_118 != uVar9);
  }
  peVar19 = (expansion *)((long)peVar18 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_78 = peVar18;
  peVar19->length_ = 0;
  peVar19->capacity_ = (index_t)local_70;
  peVar12 = local_50;
  pdVar7 = local_60;
  pdVar6 = local_98;
  peVar19[-1].x_[1] = 6.68450068066081e-318;
  GEO::expansion::assign_dot_at(peVar19,pdVar6,q2,pdVar7,(coord_index_t)peVar12);
  local_120 = (ulong)peVar19->length_;
  if (local_120 != 0) {
    uVar9 = 0;
    do {
      peVar19->x_[uVar9] = peVar19->x_[uVar9] + peVar19->x_[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_120 != uVar9);
  }
  uVar1 = ((int)local_b8 * (int)local_90 + (int)local_d8 * uVar1) * 2;
  lVar10 = (ulong)uVar1 * 8 + 0x10;
  peVar17 = (expansion *)((long)peVar19 - lVar10);
  local_100 = -lVar10;
  local_108 = peVar19;
  local_70 = peVar19;
  local_38 = peVar17;
  peVar17->length_ = 0;
  peVar17->capacity_ = uVar1;
  peVar12 = local_b0;
  peVar17[-1].x_[1] = 6.68525660109895e-318;
  GEO::expansion::assign_det2x2(peVar17,peVar12,peVar13,peVar20,peVar15);
  uVar1 = peVar20->length_;
  local_88 = (expansion *)(ulong)uVar1;
  uVar2 = peVar15->length_;
  local_90 = (expansion *)(ulong)uVar2;
  uVar9 = (ulong)(uVar1 + uVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar19 = (expansion *)((long)peVar17 - uVar9);
  *(undefined4 *)((long)peVar17 - uVar9) = 0;
  peVar19->capacity_ = uVar2 + uVar1;
  local_d8 = peVar19;
  peVar19[-1].x_[1] = 6.68563703164625e-318;
  GEO::expansion::assign_diff(peVar19,peVar20,peVar15);
  iVar16 = peVar13->length_;
  uVar1 = peVar12->length_;
  local_f0 = (ulong)uVar1;
  uVar9 = (ulong)(uVar1 + iVar16 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar17 = (expansion *)((long)peVar19 - uVar9);
  *(undefined4 *)((long)peVar19 - uVar9) = 0;
  peVar17->capacity_ = uVar1 + iVar16;
  local_b8 = peVar17;
  peVar17[-1].x_[1] = 6.68601252153709e-318;
  GEO::expansion::assign_diff(peVar17,peVar13,peVar12);
  uVar1 = ((int)local_d0 * (int)local_90 + (int)local_c8 * iVar16) * 2;
  lVar10 = (ulong)uVar1 * 8 + 0x10;
  peVar18 = (expansion *)((long)peVar17 - lVar10);
  local_f8 = -lVar10;
  local_e8 = peVar18;
  local_a8 = peVar17;
  peVar18->length_ = 0;
  peVar18->capacity_ = uVar1;
  peVar19 = local_48;
  peVar12 = local_a0;
  peVar18[-1].x_[1] = 6.68655105309105e-318;
  GEO::expansion::assign_det2x2(peVar18,peVar13,peVar19,peVar15,peVar12);
  iVar16 = peVar15->length_;
  iVar3 = peVar12->length_;
  uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar17 = (expansion *)((long)peVar18 - uVar9);
  *(undefined4 *)((long)peVar18 - uVar9) = 0;
  peVar17->capacity_ = iVar3 + iVar16;
  local_d0 = peVar17;
  peVar17[-1].x_[1] = 6.6869018396996e-318;
  GEO::expansion::assign_diff(peVar17,peVar15,peVar12);
  iVar16 = peVar19->length_;
  iVar4 = peVar13->length_;
  uVar9 = (ulong)(iVar4 + iVar16 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar15 = (expansion *)((long)peVar17 - uVar9);
  *(undefined4 *)((long)peVar17 - uVar9) = 0;
  peVar15->capacity_ = iVar4 + iVar16;
  local_90 = peVar15;
  peVar15[-1].x_[1] = 6.68724768565169e-318;
  GEO::expansion::assign_diff(peVar15,peVar19,peVar13);
  uVar1 = (iVar3 * (int)local_f0 + iVar16 * (int)local_88) * 2;
  lVar10 = (ulong)uVar1 * 8 + 0x10;
  peVar19 = (expansion *)((long)peVar15 - lVar10);
  local_88 = peVar15;
  peVar19->length_ = 0;
  peVar19->capacity_ = uVar1;
  peVar12 = local_48;
  peVar15 = local_a0;
  peVar13 = local_b0;
  peVar19[-1].x_[1] = 6.68770222604586e-318;
  GEO::expansion::assign_det2x2(peVar19,peVar12,peVar13,peVar15,peVar20);
  iVar16 = peVar15->length_;
  iVar3 = peVar20->length_;
  uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar12 = (expansion *)((long)peVar19 - uVar9);
  *(undefined4 *)((long)peVar19 - uVar9) = 0;
  peVar12->capacity_ = iVar3 + iVar16;
  local_c8 = peVar12;
  peVar12[-1].x_[1] = 6.68802336871566e-318;
  GEO::expansion::assign_diff(peVar12,peVar15,peVar20);
  peVar15 = local_48;
  iVar16 = peVar13->length_;
  iVar3 = local_48->length_;
  uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar20 = (expansion *)((long)peVar12 - uVar9);
  *(undefined4 *)((long)peVar12 - uVar9) = 0;
  peVar20->capacity_ = iVar3 + iVar16;
  local_a0 = peVar20;
  peVar20[-1].x_[1] = 6.68834945204192e-318;
  GEO::expansion::assign_diff(peVar20,peVar13,peVar15);
  uVar1 = *(uint *)((long)local_108->x_ + local_100 + -8);
  uVar2 = *(uint *)((long)local_a8->x_ + local_f8 + -8);
  local_100 = (ulong)uVar2;
  iVar8 = uVar2 + uVar1;
  uVar2 = *(uint *)((long)local_88 - lVar10);
  local_108 = (expansion *)(ulong)uVar2;
  uVar9 = (ulong)(uVar2 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar12 = (expansion *)((long)peVar20 - uVar9);
  local_a8 = (expansion *)(ulong)uVar1;
  peVar12->length_ = 0;
  peVar12->capacity_ = iVar8 + uVar2;
  peVar15 = local_38;
  peVar13 = local_e8;
  local_48 = peVar19;
  peVar12[-1].x_[1] = 6.68901150000734e-318;
  GEO::expansion::assign_sum(peVar12,peVar15,peVar13,peVar19);
  peVar15 = local_68;
  peVar13 = local_d8;
  uVar1 = *(uint *)((long)peVar20 - uVar9);
  if (uVar1 != 0) {
    local_3c = POSITIVE;
    if ((0.0 < peVar12->x_[uVar1 - 1]) || (local_3c = NEGATIVE, peVar12->x_[uVar1 - 1] < 0.0)) {
      uVar2 = local_d8->length_ * local_68->length_ * 2;
      lVar10 = (ulong)uVar2 * 8 + 0x10;
      peVar19 = (expansion *)((long)peVar12 - lVar10);
      local_88 = peVar12;
      peVar19->length_ = 0;
      peVar19->capacity_ = uVar2;
      local_f8 = (ulong)uVar1;
      peVar19[-1].x_[1] = 6.68962908206464e-318;
      GEO::expansion::assign_product(peVar19,peVar13,peVar15);
      peVar15 = local_58;
      peVar13 = local_b8;
      uVar1 = local_b8->length_ * local_58->length_ * 2;
      lVar21 = (ulong)uVar1 * 8 + 0x10;
      peVar20 = (expansion *)((long)peVar19 - lVar21);
      local_b0 = peVar12;
      peVar20->length_ = 0;
      peVar20->capacity_ = uVar1;
      peVar20[-1].x_[1] = 6.68999469064257e-318;
      GEO::expansion::assign_product(peVar20,peVar13,peVar15);
      iVar8 = *(int *)((long)peVar19 - lVar21);
      iVar11 = (int)local_a8 + *(int *)((long)local_88 - lVar10);
      local_f0 = (ulong)(iVar8 + iVar11 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
      peVar12 = (expansion *)((long)peVar20 - local_f0);
      local_f0 = -local_f0;
      local_a8 = peVar12;
      local_88 = peVar20;
      peVar12->length_ = 0;
      peVar12->capacity_ = iVar11 + iVar8;
      peVar13 = local_38;
      peVar12[-1].x_[1] = 6.6904541716932e-318;
      GEO::expansion::assign_sum(peVar12,peVar19,peVar20,peVar13);
      peVar15 = local_68;
      peVar13 = local_d0;
      uVar1 = local_d0->length_ * local_68->length_ * 2;
      lVar10 = (ulong)uVar1 * 8 + 0x10;
      peVar20 = (expansion *)((long)peVar12 - lVar10);
      local_38 = peVar12;
      peVar20->length_ = 0;
      peVar20->capacity_ = uVar1;
      peVar20[-1].x_[1] = 6.69076543305008e-318;
      GEO::expansion::assign_product(peVar20,peVar13,peVar15);
      peVar15 = local_58;
      peVar13 = local_90;
      uVar1 = local_90->length_ * local_58->length_ * 2;
      lVar21 = (ulong)uVar1 * 8 + 0x10;
      peVar19 = (expansion *)((long)peVar20 - lVar21);
      peVar19->length_ = 0;
      peVar19->capacity_ = uVar1;
      peVar19[-1].x_[1] = 6.69107669440696e-318;
      GEO::expansion::assign_product(peVar19,peVar13,peVar15);
      iVar8 = *(int *)((long)peVar20 - lVar21);
      iVar11 = (int)local_100 + *(int *)((long)local_38 - lVar10);
      uVar9 = (ulong)(iVar8 + iVar11 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
      peVar12 = (expansion *)((long)peVar19 - uVar9);
      *(undefined4 *)((long)peVar19 - uVar9) = 0;
      peVar12->capacity_ = iVar11 + iVar8;
      peVar13 = local_e8;
      local_38 = peVar12;
      peVar12[-1].x_[1] = 6.69148676889301e-318;
      GEO::expansion::assign_sum(peVar12,peVar20,peVar19,peVar13);
      peVar15 = local_68;
      peVar13 = local_c8;
      uVar1 = local_c8->length_ * local_68->length_ * 2;
      lVar10 = (ulong)uVar1 * 8 + 0x10;
      peVar20 = (expansion *)((long)peVar12 - lVar10);
      local_e8 = peVar12;
      peVar20->length_ = 0;
      peVar20->capacity_ = uVar1;
      peVar20[-1].x_[1] = 6.69181285221926e-318;
      GEO::expansion::assign_product(peVar20,peVar13,peVar15);
      peVar15 = local_58;
      peVar13 = local_a0;
      uVar1 = local_a0->length_ * local_58->length_ * 2;
      lVar21 = (ulong)uVar1 * 8 + 0x10;
      peVar12 = (expansion *)((long)peVar20 - lVar21);
      peVar12->length_ = 0;
      peVar12->capacity_ = uVar1;
      peVar12[-1].x_[1] = 6.69210929160677e-318;
      GEO::expansion::assign_product(peVar12,peVar13,peVar15);
      iVar8 = *(int *)((long)peVar20 - lVar21);
      iVar11 = (int)local_108 + *(int *)((long)local_e8 - lVar10);
      uVar9 = (ulong)(iVar8 + iVar11 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
      peVar15 = (expansion *)((long)peVar12 - uVar9);
      *(undefined4 *)((long)peVar12 - uVar9) = 0;
      peVar15->capacity_ = iVar11 + iVar8;
      peVar13 = local_48;
      local_58 = peVar15;
      peVar15[-1].x_[1] = 6.69253418806219e-318;
      GEO::expansion::assign_sum(peVar15,peVar20,peVar12,peVar13);
      peVar13 = local_128;
      uVar1 = (int)local_f8 * local_128->length_ * 2;
      lVar10 = (ulong)uVar1 * 8 + 0x10;
      peVar12 = (expansion *)((long)peVar15 - lVar10);
      *(undefined4 *)((long)peVar15 - lVar10) = 0;
      peVar12->capacity_ = uVar1;
      peVar15 = local_b0;
      local_48 = peVar12;
      peVar12[-1].x_[1] = 6.69290473729657e-318;
      GEO::expansion::assign_product(peVar12,peVar15,peVar13);
      uVar1 = (int)local_110 * *(int *)((long)local_88->x_ + local_f0 + -8) * 2;
      lVar10 = (ulong)uVar1 * 8 + 0x10;
      peVar20 = (expansion *)((long)peVar12 - lVar10);
      peVar20->length_ = 0;
      peVar20->capacity_ = uVar1;
      peVar15 = local_80;
      peVar13 = local_a8;
      peVar20[-1].x_[1] = 6.69329504915679e-318;
      GEO::expansion::assign_product(peVar20,peVar15,peVar13);
      uVar1 = *(uint *)((long)peVar12 - lVar10);
      if ((ulong)uVar1 != 0) {
        uVar9 = 0;
        do {
          peVar20->x_[uVar9] = -peVar20->x_[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      peVar15 = local_38;
      uVar2 = (int)local_118 * local_38->length_ * 2;
      lVar10 = (ulong)uVar2 * 8 + 0x10;
      peVar12 = (expansion *)((long)peVar20 - lVar10);
      peVar12->length_ = 0;
      peVar12->capacity_ = uVar2;
      peVar13 = local_78;
      peVar12[-1].x_[1] = 6.69384346202367e-318;
      GEO::expansion::assign_product(peVar12,peVar13,peVar15);
      uVar2 = *(uint *)((long)peVar20 - lVar10);
      if ((ulong)uVar2 != 0) {
        uVar9 = 0;
        do {
          peVar12->x_[uVar9] = -peVar12->x_[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      peVar15 = local_58;
      uVar5 = (int)local_120 * local_58->length_ * 2;
      lVar10 = (ulong)uVar5 * 8 + 0x10;
      peVar19 = (expansion *)((long)peVar12 - lVar10);
      local_68 = (expansion *)-lVar10;
      local_38 = peVar12;
      peVar19->length_ = 0;
      peVar19->capacity_ = uVar5;
      peVar13 = local_70;
      peVar19[-1].x_[1] = 6.6944215188293e-318;
      GEO::expansion::assign_product(peVar19,peVar13,peVar15);
      uVar5 = *(uint *)((long)local_68->x_ + (long)(local_38->x_ + -2));
      if ((ulong)uVar5 != 0) {
        uVar9 = 0;
        do {
          peVar19->x_[uVar9] = -peVar19->x_[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      peVar15 = local_48;
      iVar16 = local_48->length_;
      iVar8 = uVar1 + uVar2 + uVar5;
      uVar9 = (ulong)(iVar16 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
      peVar13 = (expansion *)((long)peVar19 - uVar9);
      local_38 = peVar19;
      peVar13->length_ = 0;
      peVar13->capacity_ = iVar8 + iVar16;
      peVar13[-1].x_[1] = 6.69504898219952e-318;
      GEO::expansion::assign_sum(peVar13,peVar15,peVar20,peVar12,peVar19);
      peVar15 = local_50;
      iVar8 = *(int *)((long)local_38 - uVar9);
      if (iVar8 != 0) {
        iVar11 = 1;
        if ((0.0 < peVar13->x_[iVar8 - 1]) || (iVar11 = -1, peVar13->x_[iVar8 - 1] < 0.0)) {
          return local_3c * iVar11;
        }
      }
      local_168 = (undefined1  [8])local_60;
      p_sort[0] = local_e0;
      p_sort[1] = local_c0;
      p_sort[2] = local_98;
      peVar13[-1].x_[1] = 6.69563197966162e-318;
      SOS_sort((double **)local_168,p_sort + 3,(index_t)peVar15);
      peVar15 = (expansion *)0x0;
      do {
        peVar19 = local_80;
        peVar20 = local_b8;
        peVar12 = local_d8;
        pdVar6 = p_sort[(long)((long)peVar15[-1].x_ + 0xf)];
        if (pdVar6 == local_60) {
          iVar16 = local_d8->length_;
          iVar3 = local_b8->length_;
          uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar19 = (expansion *)((long)peVar13 - uVar9);
          local_38 = peVar15;
          peVar19->length_ = 0;
          peVar19->capacity_ = iVar3 + iVar16;
          peVar19[-1].x_[1] = 6.69629402762704e-318;
          GEO::expansion::assign_sum(peVar19,peVar12,peVar20);
          peVar15 = local_80;
          uVar1 = local_80->length_ * *(int *)((long)peVar13 - uVar9) * 2;
          lVar10 = (ulong)uVar1 * 8 + 0x10;
          peVar12 = (expansion *)((long)peVar19 - lVar10);
          peVar12->length_ = 0;
          peVar12->capacity_ = uVar1;
          peVar12[-1].x_[1] = 6.69657564504517e-318;
          GEO::expansion::assign_product(peVar12,peVar15,peVar19);
          local_50 = (expansion *)(ulong)*(uint *)((long)peVar19 - lVar10);
          if (local_50 != (expansion *)0x0) {
            uVar9 = 0;
            do {
              peVar12->x_[uVar9] = -peVar12->x_[uVar9];
              uVar9 = uVar9 + 1;
            } while (local_50 != (expansion *)uVar9);
          }
          peVar15 = local_90;
          peVar13 = local_d0;
          iVar16 = local_d0->length_;
          iVar3 = local_90->length_;
          uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar20 = (expansion *)((long)peVar12 - uVar9);
          peVar20->length_ = 0;
          peVar20->capacity_ = iVar3 + iVar16;
          peVar20[-1].x_[1] = 6.69714876119435e-318;
          GEO::expansion::assign_sum(peVar20,peVar13,peVar15);
          peVar13 = local_78;
          uVar1 = local_78->length_ * *(int *)((long)peVar12 - uVar9) * 2;
          lVar10 = (ulong)uVar1 * 8 + 0x10;
          peVar15 = (expansion *)((long)peVar20 - lVar10);
          peVar15->length_ = 0;
          peVar15->capacity_ = uVar1;
          peVar15[-1].x_[1] = 6.69744520058185e-318;
          GEO::expansion::assign_product(peVar15,peVar13,peVar20);
          uVar1 = *(uint *)((long)peVar20 - lVar10);
          if ((ulong)uVar1 != 0) {
            uVar9 = 0;
            do {
              peVar15->x_[uVar9] = -peVar15->x_[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
          peVar20 = local_a0;
          peVar13 = local_c8;
          iVar16 = local_c8->length_;
          iVar3 = local_a0->length_;
          uVar9 = (ulong)(iVar16 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar19 = (expansion *)((long)peVar15 - uVar9);
          local_48 = peVar19;
          peVar19->length_ = 0;
          peVar19->capacity_ = iVar3 + iVar16;
          peVar19[-1].x_[1] = 6.69801831673103e-318;
          GEO::expansion::assign_sum(peVar19,peVar13,peVar20);
          peVar13 = local_70;
          uVar2 = local_70->length_ * *(int *)((long)peVar15 - uVar9) * 2;
          lVar10 = (ulong)uVar2 * 8 + 0x10;
          peVar17 = (expansion *)((long)peVar19 - lVar10);
          local_58 = peVar19;
          peVar17->length_ = 0;
          peVar17->capacity_ = uVar2;
          peVar20 = local_48;
          peVar17[-1].x_[1] = 6.69832957808791e-318;
          GEO::expansion::assign_product(peVar17,peVar13,peVar20);
          uVar2 = *(uint *)((long)local_58 - lVar10);
          if ((ulong)uVar2 != 0) {
            uVar9 = 0;
            do {
              peVar17->x_[uVar9] = -peVar17->x_[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          peVar20 = local_b0;
          iVar16 = local_b0->length_;
          iVar8 = (int)local_50 + uVar1 + uVar2;
          uVar9 = (ulong)(iVar16 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar13 = (expansion *)((long)peVar17 - uVar9);
          local_50 = peVar17;
          peVar13->length_ = 0;
          peVar13->capacity_ = iVar8 + iVar16;
          peVar13[-1].x_[1] = 6.69898174474042e-318;
          GEO::expansion::assign_sum(peVar13,peVar20,peVar12,peVar15,peVar17);
          iVar8 = *(int *)((long)local_50 - uVar9);
          peVar15 = local_38;
joined_r0x0014b083:
          local_38 = peVar15;
          if (iVar8 != 0) {
            if (0.0 < peVar13->x_[iVar8 - 1]) {
              return local_3c;
            }
            if (peVar13->x_[iVar8 - 1] < 0.0) {
              return -local_3c;
            }
          }
        }
        else {
          if (pdVar6 == local_e0) {
            uVar1 = local_80->length_ * local_d8->length_ * 2;
            lVar10 = (ulong)uVar1 * 8 + 0x10;
            peVar20 = (expansion *)((long)peVar13 - lVar10);
            local_50 = peVar20;
            local_48 = peVar13;
            peVar20->length_ = 0;
            peVar20->capacity_ = uVar1;
            local_38 = peVar15;
            peVar20[-1].x_[1] = 6.6994708697298e-318;
            GEO::expansion::assign_product(peVar20,peVar19,peVar12);
            peVar15 = local_78;
            peVar13 = local_d0;
            uVar1 = local_78->length_ * local_d0->length_ * 2;
            lVar21 = (ulong)uVar1 * 8 + 0x10;
            peVar12 = (expansion *)((long)peVar20 - lVar21);
            local_58 = peVar20;
            peVar12->length_ = 0;
            peVar12->capacity_ = uVar1;
            peVar12[-1].x_[1] = 6.69977224977377e-318;
            GEO::expansion::assign_product(peVar12,peVar15,peVar13);
            iVar16 = local_70->length_;
            peVar13 = local_c8;
LAB_0014b1b3:
            peVar15 = local_70;
            uVar1 = iVar16 * peVar13->length_ * 2;
            lVar14 = (ulong)uVar1 * 8 + 0x10;
            peVar20 = (expansion *)((long)peVar12 - lVar14);
            local_68 = peVar12;
            peVar20->length_ = 0;
            peVar20->capacity_ = uVar1;
            peVar20[-1].x_[1] = 6.70081966894295e-318;
            GEO::expansion::assign_product(peVar20,peVar15,peVar13);
            iVar11 = *(int *)((long)local_58 - lVar21) + *(int *)((long)local_48 - lVar10);
            iVar8 = *(int *)((long)local_68 - lVar14);
            uVar9 = (ulong)(iVar8 + iVar11 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
            peVar13 = (expansion *)((long)peVar20 - uVar9);
            peVar13->length_ = 0;
            peVar13->capacity_ = iVar11 + iVar8;
            peVar15 = local_50;
            peVar13[-1].x_[1] = 6.70124456539837e-318;
            GEO::expansion::assign_sum(peVar13,peVar15,peVar12,peVar20);
            iVar8 = *(int *)((long)peVar20 - uVar9);
            peVar15 = local_38;
            goto joined_r0x0014b083;
          }
          if (pdVar6 == local_c0) {
            uVar1 = local_80->length_ * local_b8->length_ * 2;
            lVar10 = (ulong)uVar1 * 8 + 0x10;
            peVar17 = (expansion *)((long)peVar13 - lVar10);
            local_50 = peVar17;
            local_48 = peVar13;
            peVar17->length_ = 0;
            peVar17->capacity_ = uVar1;
            local_38 = peVar15;
            peVar17[-1].x_[1] = 6.70020702754211e-318;
            GEO::expansion::assign_product(peVar17,peVar19,peVar20);
            peVar15 = local_78;
            peVar13 = local_90;
            uVar1 = local_78->length_ * local_90->length_ * 2;
            lVar21 = (ulong)uVar1 * 8 + 0x10;
            peVar12 = (expansion *)((long)peVar17 - lVar21);
            local_58 = peVar17;
            peVar12->length_ = 0;
            peVar12->capacity_ = uVar1;
            peVar12[-1].x_[1] = 6.70050840758607e-318;
            GEO::expansion::assign_product(peVar12,peVar15,peVar13);
            iVar16 = local_70->length_;
            peVar13 = local_a0;
            goto LAB_0014b1b3;
          }
          if (pdVar6 == local_98) {
            return NEGATIVE;
          }
        }
        peVar15 = (expansion *)((long)&peVar15->length_ + 1);
        if (peVar15 == (expansion *)0x4) {
          p_sort[3] = (double *)&stack0xfffffffffffffec8;
          peVar13[-1].x_[1] = 6.70167934316671e-318;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(p_sort + 3),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                     ,"");
          peVar13[-1].x_[1] = 6.70176333432651e-318;
          GEO::geo_should_not_have_reached((string *)(p_sort + 3),0x4d73);
        }
      } while( true );
    }
  }
  local_168 = (undefined1  [8])(p_sort + 1);
  peVar12[-1].x_[1] = 6.70215364618672e-318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Delta_sign != ZERO","");
  p_sort[3] = (double *)&stack0xfffffffffffffec8;
  peVar12[-1].x_[1] = 6.70233645047568e-318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(p_sort + 3),
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,"");
  peVar12[-1].x_[1] = (double)&LAB_0014b330;
  GEO::geo_assertion_failed((string *)local_168,(string *)(p_sort + 3),0x4d25);
}

Assistant:

Sign side3_exact_SOS(
        const double* p0, const double* p1, const double* p2, const double* p3,
        const double* q0, const double* q1, const double* q2,
        coord_index_t dim
    ) {
        PCK_STAT(cnt_side3_exact++);

        const expansion& l1 = expansion_sq_dist(p1, p0, dim);
        const expansion& l2 = expansion_sq_dist(p2, p0, dim);
        const expansion& l3 = expansion_sq_dist(p3, p0, dim);

        const expansion& a10 = expansion_dot_at(p1,q0,p0, dim).scale_fast(2.0);
        const expansion& a11 = expansion_dot_at(p1,q1,p0, dim).scale_fast(2.0);
        const expansion& a12 = expansion_dot_at(p1,q2,p0, dim).scale_fast(2.0);
        const expansion& a20 = expansion_dot_at(p2,q0,p0, dim).scale_fast(2.0);
        const expansion& a21 = expansion_dot_at(p2,q1,p0, dim).scale_fast(2.0);
        const expansion& a22 = expansion_dot_at(p2,q2,p0, dim).scale_fast(2.0);

        const expansion& a30 = expansion_dot_at(p3,q0,p0, dim).scale_fast(2.0);
        const expansion& a31 = expansion_dot_at(p3,q1,p0, dim).scale_fast(2.0);
        const expansion& a32 = expansion_dot_at(p3,q2,p0, dim).scale_fast(2.0);

        // [ b00 b01 b02 ]           [  1   1   1  ]-1
        // [ b10 b11 b12 ] = Delta * [ a10 a11 a12 ]
        // [ b20 b21 b22 ]           [ a20 a21 a22 ]

        const expansion& b00 = expansion_det2x2(a11, a12, a21, a22);
        const expansion& b01 = expansion_diff(a21, a22);
        const expansion& b02 = expansion_diff(a12, a11);
        const expansion& b10 = expansion_det2x2(a12, a10, a22, a20);
        const expansion& b11 = expansion_diff(a22, a20);
        const expansion& b12 = expansion_diff(a10, a12);
        const expansion& b20 = expansion_det2x2(a10, a11, a20, a21);
        const expansion& b21 = expansion_diff(a20, a21);
        const expansion& b22 = expansion_diff(a11, a10);

        const expansion& Delta = expansion_sum3(b00, b10, b20);
        Sign Delta_sign = Delta.sign();
        // Should not occur with symbolic
        // perturbation done at previous steps.
        geo_assert(Delta_sign != ZERO);

        //       [ Lambda0 ]   [ b01 b02 ]   [ l1 ]   [ b00 ]
        // Delta [ Lambda1 ] = [ b11 b12 ] * [    ] + [ b10 ]
        //       [ Lambda2 ]   [ b21 b22 ]   [ l2 ]   [ b20 ]

        const expansion& b01_l1 = expansion_product(b01, l1);
        const expansion& b02_l2 = expansion_product(b02, l2);
        const expansion& DeltaLambda0 = expansion_sum3(b01_l1, b02_l2, b00);

        const expansion& b11_l1 = expansion_product(b11, l1);
        const expansion& b12_l2 = expansion_product(b12, l2);
        const expansion& DeltaLambda1 = expansion_sum3(b11_l1, b12_l2, b10);

        const expansion& b21_l1 = expansion_product(b21, l1);
        const expansion& b22_l2 = expansion_product(b22, l2);
        const expansion& DeltaLambda2 = expansion_sum3(b21_l1, b22_l2, b20);

        // r = Delta*l3-(a30*DeltaLambda0+a31*DeltaLambda1+a32*DeltaLambda2)

        const expansion& r0 = expansion_product(Delta, l3);
        const expansion& r1 = expansion_product(a30, DeltaLambda0).negate();
        const expansion& r2 = expansion_product(a31, DeltaLambda1).negate();
        const expansion& r3 = expansion_product(a32, DeltaLambda2).negate();
        const expansion& r = expansion_sum4(r0, r1, r2, r3);
        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_side3_num = std::max(len_side3_num, r.length()));
        PCK_STAT(len_side3_denom = std::max(len_side3_denom, Delta.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(r_sign == ZERO) {
            PCK_STAT(cnt_side3_SOS++);
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, dim);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1_0 = expansion_sum(b01, b02);
                    const expansion& z1 = expansion_product(a30, z1_0).negate();
                    const expansion& z2_0 = expansion_sum(b11, b12);
                    const expansion& z2 = expansion_product(a31, z2_0).negate();
                    const expansion& z3_0 = expansion_sum(b21, b22);
                    const expansion& z3 = expansion_product(a32, z3_0).negate();
                    const expansion& z = expansion_sum4(Delta, z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    const expansion& z1 = expansion_product(a30, b01);
                    const expansion& z2 = expansion_product(a31, b11);
                    const expansion& z3 = expansion_product(a32, b21);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p2) {
                    const expansion& z1 = expansion_product(a30, b02);
                    const expansion& z2 = expansion_product(a31, b12);
                    const expansion& z3 = expansion_product(a32, b22);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p3) {
                    return NEGATIVE;
                }
            }
            geo_assert_not_reached;
        }
        return Sign(Delta_sign * r_sign);
    }